

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void test_prefix_sum(void)

{
  Function *pFVar1;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::CFGNode> body;
  shared_ptr<vmips::VirtReg> current;
  shared_ptr<vmips::VirtReg> acc;
  shared_ptr<vmips::VirtReg> updated;
  shared_ptr<vmips::VirtReg> added;
  shared_ptr<vmips::CFGNode> after;
  shared_ptr<vmips::VirtReg> zero;
  Function *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  int local_a0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  shared_ptr<vmips::VirtReg> local_90;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  CFGNode local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  CFGNode local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Function local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  int local_40 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined4 local_2c;
  Function local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  local_40[0] = 1;
  local_c0 = (Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::Function,std::allocator<vmips::Function>,char_const(&)[4],int>
            (&local_b8,&local_c0,(allocator<vmips::Function> *)&local_90,(char (*) [4])"sum",
             local_40);
  vmips::get_special((SpecialReg)local_40);
  vmips::Function::entry();
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  local_a0[0] = 0;
  vmips::CFGNode::append<vmips::li,int>
            ((CFGNode *)&local_90,
             (int *)*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_c0 + 0x148));
  pFVar1 = local_c0;
  vmips::get_special((SpecialReg)local_b0);
  vmips::CFGNode::append<vmips::move,std::shared_ptr<vmips::VirtReg>>
            ((CFGNode *)local_a0,
             (shared_ptr<vmips::VirtReg> *)
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pFVar1 + 0x148));
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  vmips::Function::new_section();
  vmips::Function::new_section_branch<vmips::beqz,std::shared_ptr<vmips::VirtReg>&>
            (local_50,(shared_ptr<vmips::VirtReg> *)local_c0);
  vmips::Function::switch_to(local_c0);
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_60,(shared_ptr<vmips::VirtReg> *)
                      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_c0 + 0x148),&local_90
            );
  local_2c = 0xffffffff;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_70,(shared_ptr<vmips::VirtReg> *)
                      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_c0 + 0x148),local_a0)
  ;
  vmips::Function::add_phi(local_c0,(shared_ptr *)&local_90);
  vmips::Function::add_phi(local_c0,local_70);
  vmips::Function::branch_existing<vmips::j>(local_28,(shared_ptr<vmips::CFGNode> *)local_c0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  vmips::Function::switch_to(local_c0);
  local_80 = local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  vmips::Function::assign_special(local_c0,2,&local_80);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  vmips::Function::output((ostream *)local_c0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::color();
  vmips::Function::scan_overlap();
  vmips::Function::handle_alloca();
  vmips::Function::output((ostream *)local_c0);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
  }
  return;
}

Assistant:

void test_prefix_sum() {
    auto f  = std::make_shared<Function>("sum", 1);
    auto zero = get_special(SpecialReg::zero);
    f->entry();
    auto acc = f->append<li>(0);
    auto current = f->append<move>(get_special(SpecialReg::a0));
    auto body = f->new_section();
    auto after = f->new_section_branch<beqz>(current);

    // loop body
    f->switch_to(body);
    auto added = f->append<add>(acc, current);
    auto updated = f->append<addi>(current, -1);
    f->add_phi(acc, added);
    f->add_phi(updated, current);
    f->branch_existing<j>(body);

    // loop tail
    f->switch_to(after);
    f->assign_special(SpecialReg::v0, acc);
    f->output(std::cout);
    std::cout << std::endl;
    f->color();
    f->scan_overlap();
    f->handle_alloca();
    f->output(std::cout);
}